

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void __thiscall Liby::Logger::logger_thread(Logger *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> logStr;
  
  do {
    BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pop_wait(&logStr,&this->queue_);
    if (logStr._M_string_length != 0) {
      fwrite(logStr._M_dataplus._M_p,logStr._M_string_length,1,_stderr);
    }
    std::__cxx11::string::~string((string *)&logStr);
  } while( true );
}

Assistant:

void Logger::logger_thread() {
    int64_t bytes = 0;
    //    ::alarm(1);
    //    Signal::signal(SIGALRM, [&bytes] {
    //        std::cout << "write " << bytes / (1024 * 1024) << " MB" <<
    //        std::endl;
    //        bytes = 0;
    //        ::alarm(1);
    //    });
    while (1) {
        auto logStr = queue_.pop_wait();
        if (logStr.empty())
            continue;
        bytes += logStr.size();
        ::fwrite(logStr.data(), logStr.size(), 1, stderr);
    }
}